

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomSignalPdu.cpp
# Opt level: O2

bool __thiscall DIS::IntercomSignalPdu::operator==(IntercomSignalPdu *this,IntercomSignalPdu *rhs)

{
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  bVar2 = RadioCommunicationsFamilyPdu::operator==
                    (&this->super_RadioCommunicationsFamilyPdu,
                     &rhs->super_RadioCommunicationsFamilyPdu);
  bVar3 = EntityID::operator==(&this->_entityID,&rhs->_entityID);
  bVar2 = ((this->_tdlType == rhs->_tdlType && this->_encodingScheme == rhs->_encodingScheme) &&
          (this->_samples == rhs->_samples && this->_sampleRate == rhs->_sampleRate)) &&
          (this->_communicationsDeviceID == rhs->_communicationsDeviceID && (bVar3 && bVar2));
  puVar1 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0;
      (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 != lVar4; lVar4 = lVar4 + 1) {
    bVar2 = (bool)(bVar2 & puVar1[lVar4] ==
                           (rhs->_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar4]);
  }
  return bVar2;
}

Assistant:

bool IntercomSignalPdu::operator==(const IntercomSignalPdu &rhs) const {
  bool ivarsEqual = true;

  ivarsEqual = RadioCommunicationsFamilyPdu::operator==(rhs);

  if (!(_entityID == rhs._entityID))
    ivarsEqual = false;
  if (!(_communicationsDeviceID == rhs._communicationsDeviceID))
    ivarsEqual = false;
  if (!(_encodingScheme == rhs._encodingScheme))
    ivarsEqual = false;
  if (!(_tdlType == rhs._tdlType))
    ivarsEqual = false;
  if (!(_sampleRate == rhs._sampleRate))
    ivarsEqual = false;
  if (!(_samples == rhs._samples))
    ivarsEqual = false;

  for (size_t idx = 0; idx < _data.size(); idx++) {
    if (!(_data[idx] == rhs._data[idx]))
      ivarsEqual = false;
  }

  return ivarsEqual;
}